

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.cpp
# Opt level: O2

void amrex::makeFineMask_doit<amrex::FArrayBox>
               (FabArray<amrex::FArrayBox> *mask,BoxArray *fba,IntVect *ratio,Periodicity *period,
               value_type_conflict2 crse_value,value_type_conflict2 fine_value)

{
  BaseFab<double> *this;
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  FabArray<amrex::FArrayBox> *this_00;
  pointer pIVar5;
  int i;
  int *piVar6;
  uint uVar7;
  long lVar8;
  IntVect *iv;
  long lVar9;
  IntVect *v;
  long lVar10;
  pair<int,_amrex::Box> *is;
  ulong uVar11;
  pointer ppVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  Box r;
  Vector<amrex::Array4BoxTag<double>,_std::allocator<amrex::Array4BoxTag<double>_>_> tags;
  MFIter mfi;
  Box local_1e4;
  undefined1 local_1c8 [16];
  pointer local_1b8;
  FabArray<amrex::FArrayBox> *local_1b0;
  value_type_conflict2 local_1a8;
  long local_1a0;
  value_type_conflict2 local_198;
  _Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_> local_190;
  Box local_178;
  undefined1 local_158 [16];
  pointer local_148;
  Array4<double> local_138;
  MFIter local_f8;
  BoxArray local_98;
  
  local_158 = (undefined1  [16])0x0;
  local_148 = (pointer)0x0;
  local_1a8 = crse_value;
  local_198 = fine_value;
  coarsen(&local_98,fba,ratio);
  Periodicity::shiftIntVect
            ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)&local_190,period);
  local_1c8 = (undefined1  [16])0x0;
  local_1b8 = (pointer)0x0;
  MFIter::MFIter(&local_f8,&mask->super_FabArrayBase,'\0');
  local_1b0 = mask;
  while (this_00 = local_1b0, local_f8.currentIndex < local_f8.endIndex) {
    MFIter::fabbox(&local_1e4,&local_f8);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_138,this_00,&local_f8);
    pIVar5 = local_190._M_impl.super__Vector_impl_data._M_finish;
    auVar3 = _DAT_006f8e90;
    auVar2 = _DAT_006f8e80;
    piVar6 = &local_f8.currentIndex;
    if (local_f8.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
      piVar6 = ((local_f8.local_index_map)->super_vector<int,_std::allocator<int>_>).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start + local_f8.currentIndex;
    }
    this = &(this_00->m_fabs_v).
            super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl.
            super__Vector_impl_data._M_start[*piVar6]->super_BaseFab<double>;
    uVar7 = local_1e4.bigend.vect[0] - local_1e4.smallend.vect[0];
    auVar13._4_4_ = 0;
    auVar13._0_4_ = uVar7;
    auVar13._8_4_ = uVar7;
    auVar13._12_4_ = 0;
    local_1a0 = (long)local_1e4.smallend.vect[0] * 8;
    auVar13 = auVar13 ^ _DAT_006f8e90;
    for (lVar10 = (long)local_1e4.smallend.vect[2];
        v = local_190._M_impl.super__Vector_impl_data._M_start,
        (int)lVar10 <= local_1e4.bigend.vect[2]; lVar10 = lVar10 + 1) {
      lVar9 = (long)local_138.p +
              ((long)local_1e4.smallend.vect[1] - (long)local_138.begin.y) * local_138.jstride * 8 +
              (lVar10 - local_138.begin.z) * local_138.kstride * 8 + (long)local_138.begin.x * -8 +
              local_1a0 + 8;
      for (lVar8 = (long)local_1e4.smallend.vect[1]; lVar8 <= local_1e4.bigend.vect[1];
          lVar8 = lVar8 + 1) {
        if (local_1e4.smallend.vect[0] <= local_1e4.bigend.vect[0]) {
          uVar11 = 0;
          do {
            auVar14._8_4_ = (int)uVar11;
            auVar14._0_8_ = uVar11;
            auVar14._12_4_ = (int)(uVar11 >> 0x20);
            auVar14 = (auVar14 | auVar2) ^ auVar3;
            if ((bool)(~(auVar13._4_4_ < auVar14._4_4_ ||
                        auVar13._0_4_ < auVar14._0_4_ && auVar14._4_4_ == auVar13._4_4_) & 1)) {
              *(value_type_conflict2 *)(lVar9 + -8 + uVar11 * 8) = local_1a8;
            }
            if (auVar14._12_4_ <= auVar13._12_4_ &&
                (auVar14._8_4_ <= auVar13._8_4_ || auVar14._12_4_ != auVar13._12_4_)) {
              *(value_type_conflict2 *)(lVar9 + uVar11 * 8) = local_1a8;
            }
            uVar11 = uVar11 + 2;
          } while (((ulong)uVar7 + 2 & 0xfffffffffffffffe) != uVar11);
        }
        lVar9 = lVar9 + local_138.jstride * 8;
      }
    }
    for (; v != pIVar5; v = v + 1) {
      local_178.smallend.vect[1] = local_1e4.smallend.vect[1];
      local_178.smallend.vect[0] = local_1e4.smallend.vect[0];
      local_178.btype.itype = local_1e4.btype.itype;
      local_178.bigend.vect[2] = local_1e4.bigend.vect[2];
      local_178.bigend.vect[1] = local_1e4.bigend.vect[1];
      local_178.smallend.vect[2] = local_1e4.smallend.vect[2];
      local_178.bigend.vect[0] = local_1e4.bigend.vect[0];
      Box::operator+=(&local_178,v);
      BoxArray::intersections
                (&local_98,&local_178,
                 (vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *
                 )local_1c8);
      uVar4 = local_1c8._8_8_;
      for (ppVar12 = (pointer)local_1c8._0_8_; ppVar12 != (pointer)uVar4; ppVar12 = ppVar12 + 1) {
        local_178.smallend.vect._0_8_ = *(undefined8 *)(ppVar12->second).smallend.vect;
        uVar1 = *(undefined8 *)((ppVar12->second).smallend.vect + 2);
        local_178._20_8_ = *(undefined8 *)((ppVar12->second).bigend.vect + 2);
        local_178.bigend.vect[1] =
             (int)((ulong)*(undefined8 *)(ppVar12->second).bigend.vect >> 0x20);
        local_178.smallend.vect[2] = (int)uVar1;
        local_178.bigend.vect[0] = (int)((ulong)uVar1 >> 0x20);
        Box::operator-=(&local_178,v);
        BaseFab<double>::setVal<(amrex::RunOn)1>(this,&local_198,&local_178,0);
      }
    }
    MFIter::operator++(&local_f8);
  }
  MFIter::~MFIter(&local_f8);
  std::_Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
  ~_Vector_base((_Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                 *)local_1c8);
  std::_Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>::~_Vector_base(&local_190);
  BoxArray::~BoxArray(&local_98);
  std::_Vector_base<amrex::Array4BoxTag<double>,_std::allocator<amrex::Array4BoxTag<double>_>_>::
  ~_Vector_base((_Vector_base<amrex::Array4BoxTag<double>,_std::allocator<amrex::Array4BoxTag<double>_>_>
                 *)local_158);
  return;
}

Assistant:

void makeFineMask_doit (FabArray<FAB>& mask, const BoxArray& fba,
                            const IntVect& ratio, Periodicity const& period,
                            typename FAB::value_type crse_value,
                            typename FAB::value_type fine_value)
    {
        using value_type = typename FAB::value_type;

        Vector<Array4BoxTag<value_type> > tags;

        bool run_on_gpu = Gpu::inLaunchRegion();

        const BoxArray& cfba = amrex::coarsen(fba,ratio);
        const std::vector<IntVect>& pshifts = period.shiftIntVect();
#ifdef AMREX_USE_OMP
#pragma omp parallel if (!run_on_gpu)
#endif
        {
            std::vector <std::pair<int,Box> > isects;
            for (MFIter mfi(mask); mfi.isValid(); ++mfi)
            {
                const Box& bx = mfi.fabbox();
                Array4<value_type> const& arr = mask.array(mfi);
                auto& fab = mask[mfi];

                AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                {
                    arr(i,j,k) = crse_value;
                });

                for (const auto& iv : pshifts) {
                    cfba.intersections(bx+iv, isects);
                    for (const auto& is : isects) {
                        Box const& b = is.second-iv;
                        if (run_on_gpu) {
                            tags.push_back({arr,b});
                        } else {
                            fab.template setVal<RunOn::Host>(fine_value, b);
                        }
                    }
                }
            }
        }

#ifdef AMREX_USE_GPU
        amrex::ParallelFor(tags, 1,
        [=] AMREX_GPU_DEVICE (int i, int j, int k, int n,
                              Array4BoxTag<value_type> const& tag) noexcept
        {
            tag.dfab(i,j,k,n) = fine_value;
        });
#endif
    }